

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void __thiscall DMessageBoxMenu::HandleResult(DMessageBoxMenu *this,bool res)

{
  bool bVar1;
  DMenu *pDVar2;
  undefined8 uVar3;
  FName local_18;
  byte local_11;
  DMessageBoxMenu *pDStack_10;
  bool res_local;
  DMessageBoxMenu *this_local;
  
  local_11 = res;
  pDStack_10 = this;
  bVar1 = TObjPtr<DMenu>::operator!=(&(this->super_DMenu).mParentMenu,(DMenu *)0x0);
  if ((bVar1) && (this->mMessageMode == 0)) {
    bVar1 = FName::operator==(&this->mAction,NAME_None);
    if (bVar1) {
      pDVar2 = TObjPtr<DMenu>::operator->(&(this->super_DMenu).mParentMenu);
      uVar3 = 0xd;
      if ((local_11 & 1) != 0) {
        uVar3 = 0xc;
      }
      (*(pDVar2->super_DObject)._vptr_DObject[8])(pDVar2,uVar3,0);
      (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])();
    }
    else {
      (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])();
      if ((local_11 & 1) != 0) {
        FName::FName(&local_18,&this->mAction);
        M_SetMenu(&local_18,-1);
      }
    }
    CloseSound(this);
  }
  return;
}

Assistant:

void DMessageBoxMenu::HandleResult(bool res)
{
	if (mParentMenu != NULL)
	{
		if (mMessageMode == 0)
		{
			if (mAction == NAME_None) 
			{
				mParentMenu->MenuEvent(res? MKEY_MBYes : MKEY_MBNo, false);
				Close();
			}
			else 
			{
				Close();
				if (res) M_SetMenu(mAction, -1);
			}
			CloseSound();
		}
	}
}